

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointLightCluster.cpp
# Opt level: O2

int __thiscall arealights::PointLightCluster::init(PointLightCluster *this,EVP_PKEY_CTX *ctx)

{
  string *psVar1;
  undefined8 uVar2;
  int iVar3;
  allocator<char> local_5a;
  allocator<char> local_59;
  undefined1 local_58 [40];
  string local_30;
  
  psVar1 = (string *)
           (this->_renderHelper).
           super___shared_ptr<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"../assets/PointLightCluster.vs.glsl",&local_59);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_58 + 8),"../assets/PointLightCluster.fs.glsl",&local_5a);
  RenderHelper::makeSimpleShader((RenderHelper *)local_58,psVar1,&local_30);
  uVar2 = local_58._0_8_;
  local_58._0_8_ = (__uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>)0x0;
  std::__uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::reset
            ((__uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)
             &this->_shader,(pointer)uVar2);
  std::unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::~unique_ptr
            ((unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  std::__cxx11::string::~string((string *)&local_30);
  psVar1 = (string *)
           (this->_renderHelper).
           super___shared_ptr<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"../assets/SphereLightVolume.vs.glsl",&local_59);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_58 + 8),"../assets/SphereLightVolume.fs.glsl",&local_5a);
  RenderHelper::makeSimpleShader((RenderHelper *)local_58,psVar1,&local_30);
  uVar2 = local_58._0_8_;
  local_58._0_8_ = (__uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>)0x0;
  std::__uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::reset
            ((__uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)
             &this->_sphereLightVolumeShader,(pointer)uVar2);
  std::unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::~unique_ptr
            ((unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  iVar3 = std::__cxx11::string::~string((string *)&local_30);
  return iVar3;
}

Assistant:

void PointLightCluster::init()
{
    _shader = _renderHelper->makeSimpleShader(
        "../assets/PointLightCluster.vs.glsl",
        "../assets/PointLightCluster.fs.glsl"
    );

    _sphereLightVolumeShader = _renderHelper->makeSimpleShader(
        "../assets/SphereLightVolume.vs.glsl",
        "../assets/SphereLightVolume.fs.glsl"
    );
}